

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O2

int __thiscall smf::MidiEventList::linkNotePairsLIFO(MidiEventList *this)

{
  uint uVar1;
  pointer ppMVar2;
  pointer piVar3;
  pointer pvVar4;
  MidiEvent *this_00;
  pointer pvVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  pointer ppMVar10;
  pointer piVar11;
  pointer ppVar12;
  int iVar13;
  int i_1;
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  *noteon;
  pointer this_01;
  int i;
  long lVar14;
  MidiEvent *mev;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  oldstates;
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  contevents;
  vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  noteons;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> contmap;
  
  noteons.
  super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noteons.
  super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noteons.
  super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ::resize(&noteons,0x10);
  pvVar5 = noteons.
           super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = noteons.
                 super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != pvVar5; this_01 = this_01 + 1
      ) {
    std::
    vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
    ::resize(this_01,0x80);
  }
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize(&contmap,0x80);
  for (ppVar12 = contmap.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppVar12 !=
      contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
      .super__Vector_impl_data._M_finish; ppVar12 = ppVar12 + 1) {
    ppVar12->first = 0;
    ppVar12->second = 0;
  }
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x40].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x40].second = 0;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x41].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x41].second = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x42].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x42].second = 2;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x43].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x43].second = 3;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x44].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x44].second = 4;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x45].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x45].second = 5;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x50].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x50].second = 6;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x51].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x51].second = 7;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x52].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x52].second = 8;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x53].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x53].second = 9;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x54].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x54].second = 10;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x55].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x55].second = 0xb;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x56].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x56].second = 0xc;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x57].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x57].second = 0xd;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x58].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x58].second = 0xe;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x59].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x59].second = 0xf;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x5a].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x5a].second = 0x10;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x7a].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x7a].second = 0x11;
  contevents.
  super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contevents.
  super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  contevents.
  super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ::resize(&contevents,0x12);
  oldstates.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  oldstates.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  oldstates.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&oldstates,0x12);
  for (lVar14 = 0; lVar14 != 0x12; lVar14 = lVar14 + 1) {
    std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::resize
              (contevents.
               super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar14,0x10);
    ppMVar2 = contevents.
              super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar14].
              super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppMVar10 = contevents.
                    super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar14].
                    super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppMVar10 != ppMVar2; ppMVar10 = ppMVar10 + 1)
    {
      *ppMVar10 = (MidiEvent *)0x0;
    }
    std::vector<int,_std::allocator<int>_>::resize
              (oldstates.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar14,0x10);
    piVar3 = oldstates.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar14].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ;
    for (piVar11 = oldstates.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar14].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start; piVar11 != piVar3; piVar11 = piVar11 + 1) {
      *piVar11 = -1;
    }
  }
  lVar14 = 0;
  iVar13 = 0;
  do {
    ppMVar10 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->list).
                            super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar10) >> 3) <=
        lVar14) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&oldstates);
      std::
      vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
      ::~vector(&contevents);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&contmap.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
      std::
      vector<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
      ::~vector(&noteons);
      return iVar13;
    }
    mev = ppMVar10[lVar14];
    MidiEvent::unlinkEvent(mev);
    bVar6 = MidiMessage::isNoteOn(&mev->super_MidiMessage);
    if (bVar6) {
      iVar7 = MidiMessage::getKeyNumber(&mev->super_MidiMessage);
      iVar8 = MidiMessage::getChannel(&mev->super_MidiMessage);
      std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::push_back
                (noteons.
                 super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar8].
                 super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar7,&mev);
    }
    else {
      bVar6 = MidiMessage::isNoteOff(&mev->super_MidiMessage);
      if (bVar6) {
        iVar7 = MidiMessage::getKeyNumber(&mev->super_MidiMessage);
        iVar8 = MidiMessage::getChannel(&mev->super_MidiMessage);
        pvVar4 = noteons.
                 super__Vector_base<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar8].
                 super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppMVar10 = *(pointer *)
                    ((long)&pvVar4[iVar7].
                            super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                            _M_impl.super__Vector_impl_data + 8);
        if (ppMVar10 !=
            pvVar4[iVar7].super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          this_00 = ppMVar10[-1];
          *(pointer *)
           ((long)&pvVar4[iVar7].
                   super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                   super__Vector_impl_data + 8) = ppMVar10 + -1;
          MidiEvent::linkEvent(this_00,mev);
          iVar13 = iVar13 + 1;
        }
      }
      else {
        bVar6 = MidiMessage::isController(&mev->super_MidiMessage);
        if (bVar6) {
          iVar7 = MidiMessage::getP1(&mev->super_MidiMessage);
          if (contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar7].first != 0) {
            iVar7 = contmap.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar7].second;
            iVar8 = MidiMessage::getChannel(&mev->super_MidiMessage);
            iVar9 = MidiMessage::getP2(&mev->super_MidiMessage);
            uVar1 = oldstates.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar7].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[iVar8];
            if ((iVar9 < 0x40) || (uVar1 != 0xffffffff)) {
              if (uVar1 != 0x3f < iVar9) {
                if ((0x3f < iVar9) && (uVar1 == 0)) goto LAB_0011a1e3;
                if ((iVar9 < 0x40) && (uVar1 == 1)) {
                  MidiEvent::linkEvent
                            (contevents.
                             super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar7].
                             super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar8],mev);
                  oldstates.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar7].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[iVar8] = (uint)(0x3f < iVar9);
                  contevents.
                  super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar7].
                  super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar8] = mev;
                }
              }
            }
            else {
LAB_0011a1e3:
              contevents.
              super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar7].
              super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
              super__Vector_impl_data._M_start[iVar8] = mev;
              oldstates.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar7].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [iVar8] = 1;
            }
          }
        }
      }
    }
    lVar14 = lVar14 + 1;
  } while( true );
}

Assistant:

int MidiEventList::linkNotePairsLIFO(void) {

	// Note-on states:
	// dimension 1: MIDI channel (0-15)
	// dimension 2: MIDI key     (0-127)  (but 0 not used for note-ons)
	// dimension 3: List of active note-ons or note-offs.
	std::vector<std::vector<std::vector<MidiEvent*>>> noteons;
	noteons.resize(16);
	for (auto& noteon : noteons) {
		noteon.resize(128);
	}

	// Controller linking: The following General MIDI controller numbers are
	// also monitored for linking within the track (but not between tracks).
	// hex dec  name                                    range
	// 40  64   Hold pedal (Sustain) on/off             0..63=off  64..127=on
	// 41  65   Portamento on/off                       0..63=off  64..127=on
	// 42  66   Sustenuto Pedal on/off                  0..63=off  64..127=on
	// 43  67   Soft Pedal on/off                       0..63=off  64..127=on
	// 44  68   Legato Pedal on/off                     0..63=off  64..127=on
	// 45  69   Hold Pedal 2 on/off                     0..63=off  64..127=on
	// 50  80   General Purpose Button                  0..63=off  64..127=on
	// 51  81   General Purpose Button                  0..63=off  64..127=on
	// 52  82   General Purpose Button                  0..63=off  64..127=on
	// 53  83   General Purpose Button                  0..63=off  64..127=on
	// 54  84   Undefined on/off                        0..63=off  64..127=on
	// 55  85   Undefined on/off                        0..63=off  64..127=on
	// 56  86   Undefined on/off                        0..63=off  64..127=on
	// 57  87   Undefined on/off                        0..63=off  64..127=on
	// 58  88   Undefined on/off                        0..63=off  64..127=on
	// 59  89   Undefined on/off                        0..63=off  64..127=on
	// 5A  90   Undefined on/off                        0..63=off  64..127=on
	// 7A 122   Local Keyboard On/Off                   0..63=off  64..127=on

	// first keep track of whether the controller is an on/off switch:
	std::vector<std::pair<int, int>> contmap;
	contmap.resize(128);
	std::pair<int, int> zero(0, 0);
	std::fill(contmap.begin(), contmap.end(), zero);
	contmap[64].first  = 1;   contmap[64].second = 0;
	contmap[65].first  = 1;   contmap[65].second = 1;
	contmap[66].first  = 1;   contmap[66].second = 2;
	contmap[67].first  = 1;   contmap[67].second = 3;
	contmap[68].first  = 1;   contmap[68].second = 4;
	contmap[69].first  = 1;   contmap[69].second = 5;
	contmap[80].first  = 1;   contmap[80].second = 6;
	contmap[81].first  = 1;   contmap[81].second = 7;
	contmap[82].first  = 1;   contmap[82].second = 8;
	contmap[83].first  = 1;   contmap[83].second = 9;
	contmap[84].first  = 1;   contmap[84].second = 10;
	contmap[85].first  = 1;   contmap[85].second = 11;
	contmap[86].first  = 1;   contmap[86].second = 12;
	contmap[87].first  = 1;   contmap[87].second = 13;
	contmap[88].first  = 1;   contmap[88].second = 14;
	contmap[89].first  = 1;   contmap[89].second = 15;
	contmap[90].first  = 1;   contmap[90].second = 16;
	contmap[122].first = 1;   contmap[122].second = 17;

	// dimensions:
	// 1: mapped controller (0 to 17)
	// 2: channel (0 to 15)
	std::vector<std::vector<MidiEvent*>> contevents;
	contevents.resize(18);
	std::vector<std::vector<int>> oldstates;
	oldstates.resize(18);
	for (int i=0; i<18; i++) {
		contevents[i].resize(16);
		std::fill(contevents[i].begin(), contevents[i].end(), nullptr);
		oldstates[i].resize(16);
		std::fill(oldstates[i].begin(), oldstates[i].end(), -1);
	}

	// Now iterate through the MidiEventList keeping track of note and
	// select controller states and linking notes/controllers as needed.
	int channel;
	int key;
	int contnum;
	int contval;
	int conti;
	int contstate;
	int counter = 0;
	MidiEvent* mev;
	MidiEvent* noteon;
	for (int i=0; i<getSize(); i++) {
		mev = &getEvent(i);
		mev->unlinkEvent();
		if (mev->isNoteOn()) {
			// store the note-on to pair later with a note-off message.
			key = mev->getKeyNumber();
			channel = mev->getChannel();
			noteons[channel][key].push_back(mev);
		} else if (mev->isNoteOff()) {
			key = mev->getKeyNumber();
			channel = mev->getChannel();
			if (noteons[channel][key].size() > 0) {
				noteon = noteons[channel][key].back();
				noteons[channel][key].pop_back();
				noteon->linkEvent(mev);
				counter++;
			}
		} else if (mev->isController()) {
			contnum = mev->getP1();
			if (contmap[contnum].first) {
				conti     = contmap[contnum].second;
				channel   = mev->getChannel();
				contval   = mev->getP2();
				contstate = contval < 64 ? 0 : 1;
				if ((oldstates[conti][channel] == -1) && contstate) {
					// a newly initialized onstate was detected, so store for
					// later linking to an off state.
					contevents[conti][channel] = mev;
					oldstates[conti][channel] = contstate;
				} else if (oldstates[conti][channel] == contstate) {
					// the controller state is redundant and will be ignored.
				} else if ((oldstates[conti][channel] == 0) && contstate) {
					// controller is currently off, so store on-state for next link
					contevents[conti][channel] = mev;
					oldstates[conti][channel] = contstate;
				} else if ((oldstates[conti][channel] == 1) && (contstate == 0)) {
					// controller has just been turned off, so link to
					// stored on-message.
					contevents[conti][channel]->linkEvent(mev);
					oldstates[conti][channel] = contstate;
					// not necessary, but maybe use for something later:
					contevents[conti][channel] = mev;
				}
			}
		}
	}
	return counter;
}